

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.cpp
# Opt level: O1

bool __thiscall CPubKey::Decompress(CPubKey *this)

{
  byte bVar1;
  int iVar2;
  size_t inputlen;
  long in_FS_OFFSET;
  bool bVar3;
  size_t publen;
  uchar pub [65];
  secp256k1_pubkey pubkey;
  size_t local_c0;
  uchar local_b8 [80];
  secp256k1_pubkey local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = this->vch[0];
  if ((bVar1 & 0xfe) != 2) {
    bVar3 = false;
    if ((7 < bVar1) || (bVar3 = false, (0xd0U >> (bVar1 & 0x1f) & 1) == 0)) goto LAB_0076bee5;
  }
  inputlen = 0x21;
  if ((bVar1 & 0xfe) != 2) {
    if ((byte)(bVar1 - 4) < 4) {
      inputlen = (&DAT_0081cf98)[(byte)(bVar1 - 4)];
    }
    else {
      inputlen = 0;
    }
  }
  iVar2 = secp256k1_ec_pubkey_parse(secp256k1_context_static,&local_68,this->vch,inputlen);
  bVar3 = iVar2 != 0;
  if (bVar3) {
    local_c0 = 0x41;
    secp256k1_ec_pubkey_serialize(secp256k1_context_static,local_b8,&local_c0,&local_68,2);
    Set<unsigned_char*>(this,local_b8,local_b8 + local_c0);
  }
LAB_0076bee5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CPubKey::Decompress() {
    if (!IsValid())
        return false;
    secp256k1_pubkey pubkey;
    if (!secp256k1_ec_pubkey_parse(secp256k1_context_static, &pubkey, vch, size())) {
        return false;
    }
    unsigned char pub[SIZE];
    size_t publen = SIZE;
    secp256k1_ec_pubkey_serialize(secp256k1_context_static, pub, &publen, &pubkey, SECP256K1_EC_UNCOMPRESSED);
    Set(pub, pub + publen);
    return true;
}